

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O2

UniquePtr<SSL_CREDENTIAL>
ssl_credential_new_spake2plusv1
          (SSLCredentialType type,Span<const_unsigned_char> context,
          Span<const_unsigned_char> client_identity,Span<const_unsigned_char> server_identity,
          uint32_t limit)

{
  bool bVar1;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true> _Var2;
  undefined4 in_register_0000008c;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  UniquePtr<ssl_credential_st> cred;
  __int_type in_stack_00000018;
  _Head_base<0UL,_ssl_credential_st_*,_false> local_38;
  SSLCredentialType local_2c;
  
  _Var2.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  _Var2.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._0_4_ = type;
  local_2c = (SSLCredentialType)context.data_;
  if ((local_2c & ~kDelegated) != kSPAKE2PlusV1Client) {
    __assert_fail("type == SSLCredentialType::kSPAKE2PlusV1Client || type == SSLCredentialType::kSPAKE2PlusV1Server"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,499,
                  "UniquePtr<SSL_CREDENTIAL> ssl_credential_new_spake2plusv1(SSLCredentialType, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>, uint32_t)"
                 );
  }
  in_00.size_._4_4_ = in_register_0000008c;
  in_00.size_._0_4_ = limit;
  local_38._M_head_impl = bssl::New<ssl_credential_st,bssl::SSLCredentialType&>(&local_2c);
  if (local_38._M_head_impl != (ssl_credential_st *)0x0) {
    in.size_ = (size_t)client_identity.data_;
    in.data_ = (uchar *)context.size_;
    bVar1 = bssl::Array<unsigned_char>::CopyFrom(&(local_38._M_head_impl)->pake_context,in);
    if (bVar1) {
      in_00.data_ = (uchar *)client_identity.size_;
      bVar1 = bssl::Array<unsigned_char>::CopyFrom(&(local_38._M_head_impl)->client_identity,in_00);
      if (bVar1) {
        bVar1 = bssl::Array<unsigned_char>::CopyFrom
                          (&(local_38._M_head_impl)->server_identity,server_identity);
        if (bVar1) {
          LOCK();
          ((local_38._M_head_impl)->pake_limit).super___atomic_base<unsigned_int>._M_i =
               in_stack_00000018;
          UNLOCK();
          *(ssl_credential_st **)
           _Var2.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl = local_38._M_head_impl;
          local_38._M_head_impl = (ssl_credential_st *)0x0;
          goto LAB_0014de21;
        }
      }
    }
  }
  *(undefined8 *)
   _Var2.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
   super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
   super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl = 0;
LAB_0014de21:
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&local_38);
  return (__uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<ssl_credential_st_*,_bssl::internal::Deleter>)
         _Var2.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
}

Assistant:

static UniquePtr<SSL_CREDENTIAL> ssl_credential_new_spake2plusv1(
    SSLCredentialType type, Span<const uint8_t> context,
    Span<const uint8_t> client_identity, Span<const uint8_t> server_identity,
    uint32_t limit) {
  assert(type == SSLCredentialType::kSPAKE2PlusV1Client ||
         type == SSLCredentialType::kSPAKE2PlusV1Server);
  auto cred = MakeUnique<SSL_CREDENTIAL>(type);
  if (cred == nullptr) {
    return nullptr;
  }

  if (!cred->pake_context.CopyFrom(context) ||
      !cred->client_identity.CopyFrom(client_identity) ||
      !cred->server_identity.CopyFrom(server_identity)) {
    return nullptr;
  }

  cred->pake_limit.store(limit);
  return cred;
}